

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTADSBEx.cpp
# Opt level: O3

string * __thiscall
ADSBBase::FetchMsg_abi_cxx11_(string *__return_storage_ptr__,ADSBBase *this,char *buf)

{
  JSON_Value *value;
  JSON_Object *object;
  char *pcVar1;
  string s;
  allocator<char> local_39;
  long *local_38;
  long local_30;
  long local_28 [2];
  
  value = json_parse_string((char *)0x146ce8);
  if (value == (JSON_Value *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    object = json_object(value);
    if (object == (JSON_Object *)0x0) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    }
    else {
      pcVar1 = jog_s(object,"message");
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,pcVar1,&local_39);
      if (local_30 == 0) {
        pcVar1 = jog_s(object,"msg");
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,pcVar1,&local_39);
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)__return_storage_ptr__,local_38,local_30 + (long)local_38);
      }
      if (local_38 != local_28) {
        operator_delete(local_38,local_28[0] + 1);
      }
    }
    json_value_free(value);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ADSBBase::FetchMsg (const char* buf)
{
    // try to interpret it as JSON, then fetch 'msg' field content
    JSONRootPtr pRoot (buf);
    if (!pRoot) return std::string();
    const JSON_Object* pObj = json_object(pRoot.get());
    if (!pObj) return std::string();
    const std::string s = jog_s(pObj, ADSBEX_MESSAGE);  // try 'message' first
    if (!s.empty())
        return s;
    else
        return jog_s(pObj, ADSBEX_MSG);                 // else try 'msg' as per documentation
}